

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ImportSharedObjectIntoProcess
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CObjectType *pot,CObjectAttributes *poa
          ,SHMPTR shmSharedObjectData,SHMObjData *psmod,bool fAddRefSharedData,
          CSharedMemoryObject **ppshmobj)

{
  LIST_ENTRY *pLVar1;
  _LIST_ENTRY *p_Var2;
  PAL_ERROR PVar3;
  PLIST_ENTRY _EX_ListHead;
  CSharedMemoryWaitableObject *pCVar4;
  bool bVar5;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x447);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pot == (CObjectType *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x448);
    fprintf(_stderr,"Expression: NULL != pot\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x449);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (shmSharedObjectData == 0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x44a);
    fprintf(_stderr,"Expression: SHMNULL != shmSharedObjectData\n");
  }
  if (psmod == (SHMObjData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,1099);
    fprintf(_stderr,"Expression: NULL != psmod\n");
  }
  if (ppshmobj == (CSharedMemoryObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x44c);
    fprintf(_stderr,"Expression: NULL != ppshmobj\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (pot->m_eSynchronizationSupport == WaitableObject) {
      pCVar4 = InternalNew<CorUnix::CSharedMemoryWaitableObject,CorUnix::CObjectType*,_CRITICAL_SECTION*,unsigned_long,CorUnix::_SHMObjData*,bool>
                         (pot,&this->m_csListLock,shmSharedObjectData,psmod,fAddRefSharedData);
    }
    else {
      pCVar4 = (CSharedMemoryWaitableObject *)
               InternalNew<CorUnix::CSharedMemoryObject,CorUnix::CObjectType*,_CRITICAL_SECTION*,unsigned_long,CorUnix::_SHMObjData*,bool>
                         (pot,&this->m_csListLock,shmSharedObjectData,psmod,fAddRefSharedData);
    }
    if (pCVar4 == (CSharedMemoryWaitableObject *)0x0) {
      PVar3 = 0xe;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d6c15;
    }
    else {
      PVar3 = (*(pCVar4->super_CSharedMemoryObject).super_CPalObjectBase.super_IPalObject.
                _vptr_IPalObject[0x10])(pCVar4,pthr,poa);
      if (PVar3 == 0) {
        bVar5 = psmod->dwNameLength == 0;
        p_Var2 = (&this->m_leNamedObjects)[bVar5].Blink;
        pLVar1 = &(pCVar4->super_CSharedMemoryObject).m_le;
        (pCVar4->super_CSharedMemoryObject).m_le.Flink = &this->m_leNamedObjects + bVar5;
        (pCVar4->super_CSharedMemoryObject).m_le.Blink = p_Var2;
        p_Var2->Flink = pLVar1;
        (&this->m_leNamedObjects)[bVar5].Blink = pLVar1;
        *ppshmobj = &pCVar4->super_CSharedMemoryObject;
        PVar3 = 0;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar3;
    }
  }
LAB_001d6c15:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ImportSharedObjectIntoProcess(
    CPalThread *pthr,
    CObjectType *pot,
    CObjectAttributes *poa,
    SHMPTR shmSharedObjectData,
    SHMObjData *psmod,
    bool fAddRefSharedData,
    CSharedMemoryObject **ppshmobj
    )
{
    PAL_ERROR palError = NO_ERROR;
    CSharedMemoryObject *pshmobj;
    PLIST_ENTRY pleObjectList;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pot);
    _ASSERTE(NULL != poa);
    _ASSERTE(SHMNULL != shmSharedObjectData);
    _ASSERTE(NULL != psmod);
    _ASSERTE(NULL != ppshmobj);

    ENTRY("CSharedMemoryObjectManager::ImportSharedObjectIntoProcess(pthr=%p, "
        "pot=%p, poa=%p, shmSharedObjectData=%p, psmod=%p, fAddRefSharedData=%d, "
        "ppshmobj=%p)\n",
        pthr,
        pot,
        poa,
        shmSharedObjectData,
        psmod,
        fAddRefSharedData,
        ppshmobj
        );
    
    if (CObjectType::WaitableObject == pot->GetSynchronizationSupport())
    {
        pshmobj = InternalNew<CSharedMemoryWaitableObject>(pot,
                                                           &m_csListLock,
                                                           shmSharedObjectData,
                                                           psmod,
                                                           fAddRefSharedData);
    }
    else
    {
        pshmobj = InternalNew<CSharedMemoryObject>(pot,
                                                   &m_csListLock,
                                                   shmSharedObjectData,
                                                   psmod,
                                                   fAddRefSharedData);
    }

    if (NULL != pshmobj)
    {
        palError = pshmobj->InitializeFromExistingSharedData(pthr, poa);
        if (NO_ERROR == palError)
        {
            if (0 != psmod->dwNameLength)
            {
                pleObjectList = &m_leNamedObjects;
            }
            else
            {
                pleObjectList = &m_leAnonymousObjects;
            }
            
            InsertTailList(pleObjectList, pshmobj->GetObjectListLink());
        }
        else
        {
            goto ImportSharedObjectIntoProcessExit;
        }
    }
    else
    {
        ERROR("Unable to allocate new object\n");
        palError = ERROR_OUTOFMEMORY;
        goto ImportSharedObjectIntoProcessExit;
    }

    *ppshmobj = pshmobj;

ImportSharedObjectIntoProcessExit:

    LOGEXIT("CSharedMemoryObjectManager::ImportSharedObjectIntoProcess returns %d\n", palError);

    return palError;
}